

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

void __thiscall slang::ast::TypePrinter::printUnpackedArrayDim(TypePrinter *this,Type *type)

{
  Type *pTVar1;
  char *end;
  char *begin;
  FormatBuffer *this_00;
  FixedSizeUnpackedArrayType *at;
  format_string<const_unsigned_int_&> fmt;
  format_string<const_int_&,_const_int_&> fmt_00;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  switch((type->super_Symbol).kind) {
  case FixedSizeUnpackedArrayType:
    fmt_00.str.size_ = 7;
    fmt_00.str.data_ = "[{}:{}]";
    FormatBuffer::format<int_const&,int_const&>
              ((this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt_00,
               (int *)&type[1].super_Symbol.name,
               (int *)((long)&type[1].super_Symbol.name._M_len + 4));
    break;
  case DynamicArrayType:
  case DPIOpenArrayType:
    this_00 = (this->buffer)._M_t.
              super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
              .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    begin = "[]";
    end = "";
    goto LAB_003eaba4;
  case AssociativeArrayType:
    this_00 = (this->buffer)._M_t.
              super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
              .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    if (type[1].super_Symbol.name._M_len == 0) {
      begin = "[*]";
      end = "";
    }
    else {
      ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00,"[","");
      local_20._M_len = 0;
      local_20._M_str = "";
      Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
                ((Symbol *)type[1].super_Symbol.name._M_len,this,&local_20);
      this_00 = (this->buffer)._M_t.
                super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                ._M_t.
                super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
      begin = "]";
      end = "";
    }
LAB_003eaba4:
    ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00,begin,end);
    break;
  case QueueType:
    this_00 = (this->buffer)._M_t.
              super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
              .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
    if ((int)type[1].super_Symbol.name._M_len == 0) {
      begin = "[$]";
      end = "";
      goto LAB_003eaba4;
    }
    fmt.str.size_ = 6;
    fmt.str.data_ = "[$:{}]";
    FormatBuffer::format<unsigned_int_const&>(this_00,fmt,(uint *)&type[1].super_Symbol.name);
    break;
  default:
    goto switchD_003eaad7_default;
  }
  pTVar1 = Type::getArrayElementType(type);
  pTVar1 = Type::getCanonicalType(pTVar1);
  printUnpackedArrayDim(this,pTVar1);
switchD_003eaad7_default:
  return;
}

Assistant:

void TypePrinter::printUnpackedArrayDim(const Type& type) {
    switch (type.kind) {
        case SymbolKind::FixedSizeUnpackedArrayType: {
            auto& at = type.as<FixedSizeUnpackedArrayType>();
            buffer->format("[{}:{}]", at.range.left, at.range.right);
            break;
        }
        case SymbolKind::DynamicArrayType:
        case SymbolKind::DPIOpenArrayType:
            buffer->append("[]");
            break;
        case SymbolKind::AssociativeArrayType: {
            auto& at = type.as<AssociativeArrayType>();
            if (!at.indexType) {
                buffer->append("[*]");
            }
            else {
                buffer->append("[");
                at.indexType->visit(*this, ""sv);
                buffer->append("]");
            }
            break;
        }
        case SymbolKind::QueueType: {
            auto& at = type.as<QueueType>();
            if (at.maxBound)
                buffer->format("[$:{}]", at.maxBound);
            else
                buffer->append("[$]");
            break;
        }
        default:
            return;
    }

    // We can only reach this if we know we have an array type.
    printUnpackedArrayDim(type.getArrayElementType()->getCanonicalType());
}